

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O0

void __thiscall
pstore::http::
buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
::buffered_reader(buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                  *this,_func_error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<unsigned_char,__1L>_ptr
                        *refill,size_t buffer_size)

{
  size_type __n;
  unsigned_long *puVar1;
  storage_type<pstore::gsl::details::extent_type<_1L>_> sVar2;
  allocator<unsigned_char> local_2a;
  value_type_conflict3 local_29;
  unsigned_long local_28;
  size_t local_20;
  size_t buffer_size_local;
  _func_error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<unsigned_char,__1L>_ptr
  *refill_local;
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *this_local;
  
  this->refill_ = refill;
  local_28 = 1;
  local_20 = buffer_size;
  buffer_size_local = (size_t)refill;
  refill_local = (_func_error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<unsigned_char,__1L>_ptr
                  *)this;
  puVar1 = std::max<unsigned_long>(&local_20,&local_28);
  __n = *puVar1;
  local_29 = '\0';
  std::allocator<unsigned_char>::allocator(&local_2a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->buf_,__n,&local_29,&local_2a);
  std::allocator<unsigned_char>::~allocator(&local_2a);
  sVar2 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
          pstore::gsl::make_span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (&this->buf_);
  (this->span_).storage_ = sVar2;
  pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&this->pos_);
  pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&this->end_);
  this->is_eof_ = false;
  maybe<unsigned_char,_void>::maybe(&this->push_);
  check_invariants(this);
  return;
}

Assistant:

buffered_reader<IO, RefillFunction>::buffered_reader (RefillFunction const refill,
                                                              std::size_t const buffer_size)
                : refill_{refill}
                , buf_ (std::max (buffer_size, std::size_t{1}), std::uint8_t{0})
                , span_{gsl::make_span (buf_)}
                , pos_{span_.begin ()}
                , end_{span_.begin ()} {
            this->check_invariants ();
        }